

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorList.c
# Opt level: O2

Cube * CubeExtract(Cube *p)

{
  Cube *pCVar1;
  Cube **ppCVar2;
  
  if (p->ID != '\0') {
    pCVar1 = p->Next;
    if (s_List == p) {
      ppCVar2 = &s_List;
    }
    else {
      ppCVar2 = &p->Prev->Next;
    }
    *ppCVar2 = pCVar1;
    if (pCVar1 != (Cube *)0x0) {
      pCVar1->Prev = p->Prev;
    }
    p->Prev = (cube *)0x0;
    p->Next = (cube *)0x0;
    g_CoverInfo.nCubesInUse = g_CoverInfo.nCubesInUse + -1;
    return p;
  }
  __assert_fail("p->ID",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/exor/exorList.c"
                ,0x34f,"Cube *CubeExtract(Cube *)");
}

Assistant:

Cube* CubeExtract( Cube* p )
// extracts the cube from storage
{
//  assert( p->Prev && p->Next ); // can be done only with rings
    assert( p->ID );

//  if ( s_List == p )
//      s_List = p->Next;
//  if ( p->Prev )
//      p->Prev->Next = p->Next;

    if ( s_List == p )
        s_List = p->Next;
    else
        p->Prev->Next = p->Next;

    if ( p->Next )
        p->Next->Prev = p->Prev;

    p->Prev = NULL;
    p->Next = NULL;

    g_CoverInfo.nCubesInUse--;
    return p;
}